

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_interaction.cpp
# Opt level: O0

int AF__PlayerInfo_PoisonPlayer
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  player_t *player;
  AActor *poisoner_00;
  AActor *source_00;
  bool bVar1;
  bool local_5e;
  bool local_5b;
  int u;
  int poison;
  AActor *source;
  AActor *poisoner;
  player_t *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                  ,0x6d8,
                  "int AF__PlayerInfo_PoisonPlayer(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if ((param->field_0).field_3.Type != '\x03') {
    __assert_fail("param[paramnum].Type == REGT_POINTER",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                  ,0x6d8,
                  "int AF__PlayerInfo_PoisonPlayer(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  player = (player_t *)(param->field_0).field_1.a;
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                  ,0x6d9,
                  "int AF__PlayerInfo_PoisonPlayer(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar1 = false;
  if ((param[1].field_0.field_3.Type == '\x03') &&
     (bVar1 = true, param[1].field_0.field_1.atag != 1)) {
    bVar1 = param[1].field_0.field_1.a == (void *)0x0;
  }
  if (bVar1) {
    poisoner_00 = (AActor *)param[1].field_0.field_1.a;
    local_5b = true;
    if (poisoner_00 != (AActor *)0x0) {
      local_5b = DObject::IsKindOf((DObject *)poisoner_00,AActor::RegistrationInfo.MyClass);
    }
    if (local_5b == false) {
      __assert_fail("poisoner == NULL || poisoner->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                    ,0x6d9,
                    "int AF__PlayerInfo_PoisonPlayer(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    if (numparam < 3) {
      __assert_fail("(paramnum) < numparam",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                    ,0x6da,
                    "int AF__PlayerInfo_PoisonPlayer(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    bVar1 = false;
    if ((param[2].field_0.field_3.Type == '\x03') &&
       (bVar1 = true, param[2].field_0.field_1.atag != 1)) {
      bVar1 = param[2].field_0.field_1.a == (void *)0x0;
    }
    if (bVar1) {
      source_00 = (AActor *)param[2].field_0.field_1.a;
      local_5e = true;
      if (source_00 != (AActor *)0x0) {
        local_5e = DObject::IsKindOf((DObject *)source_00,AActor::RegistrationInfo.MyClass);
      }
      if (local_5e == false) {
        __assert_fail("source == NULL || source->IsKindOf(RUNTIME_CLASS(AActor))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                      ,0x6da,
                      "int AF__PlayerInfo_PoisonPlayer(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      if (numparam < 4) {
        __assert_fail("(paramnum) < numparam",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                      ,0x6db,
                      "int AF__PlayerInfo_PoisonPlayer(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      if (param[3].field_0.field_3.Type != '\0') {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                      ,0x6db,
                      "int AF__PlayerInfo_PoisonPlayer(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      bVar1 = P_PoisonPlayer(player,poisoner_00,source_00,param[3].field_0.i);
      if (numret < 1) {
        param_local._4_4_ = 0;
      }
      else {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                        ,0x6dc,
                        "int AF__PlayerInfo_PoisonPlayer(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        VMReturn::SetInt(ret,(uint)bVar1);
        param_local._4_4_ = 1;
      }
      return param_local._4_4_;
    }
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                  ,0x6da,
                  "int AF__PlayerInfo_PoisonPlayer(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                ,0x6d9,
                "int AF__PlayerInfo_PoisonPlayer(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(_PlayerInfo, PoisonPlayer)
{
	PARAM_SELF_STRUCT_PROLOGUE(player_t);
	PARAM_OBJECT(poisoner, AActor);
	PARAM_OBJECT(source, AActor);
	PARAM_INT(poison);
	ACTION_RETURN_BOOL(P_PoisonPlayer(self, poisoner, source, poison));
}